

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  bool bVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  const_iterator local_70;
  iterator piter;
  
  sVar2 = root_name_length(this);
  bVar1 = has_root_directory(this);
  if (bVar1 + sVar2 < (this->_path)._M_string_length) {
    end(&piter,this);
    local_70._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    last._M_current = (char *)iterator::decrement(&piter,&local_70);
    first._M_current = (this->_path)._M_dataplus._M_p;
    if (first._M_current + bVar1 + sVar2 < last._M_current) {
      last._M_current = last._M_current + -(ulong)(*last._M_current != '/');
    }
    path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__return_storage_ptr__,first,last,native_format);
    std::__cxx11::string::~string((string *)&piter._current);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    if (rootPathLen < _path.length()) {
        if (empty()) {
            return path();
        }
        else {
            auto piter = end();
            auto iter = piter.decrement(_path.end());
            if (iter > _path.begin() + static_cast<long>(rootPathLen) && *iter != preferred_separator) {
                --iter;
            }
            return path(_path.begin(), iter, native_format);
        }
    }
    else {
        return *this;
    }
}